

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryUnorderedTypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::SimpleDictionaryUnorderedTypeHandler<unsigned_short,_const_Js::PropertyRecord_*,_true>::
TryReuseDeletedPropertyIndex
          (SimpleDictionaryUnorderedTypeHandler<unsigned_short,_const_Js::PropertyRecord_*,_true>
           *this,DynamicObject *object,unsigned_short *propertyIndex)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSVar5;
  Var pvVar6;
  
  if (object == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                ,0x46,"(object)","object");
    if (!bVar3) goto LAB_00e4ba0d;
    *puVar4 = 0;
  }
  if (propertyIndex == (unsigned_short *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                ,0x47,"(propertyIndex)","propertyIndex");
    if (!bVar3) goto LAB_00e4ba0d;
    *puVar4 = 0;
  }
  uVar1 = *(ushort *)
           &(this->
            super_SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>)
            .field_0x2c;
  if (uVar1 != 0xffff) {
    pSVar5 = JsUtil::
             BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
             ::GetValueAt((this->
                          super_SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>
                          ).propertyMap.ptr,(uint)uVar1);
    if (pSVar5->propertyIndex !=
        *(unsigned_short *)
         &(this->
          super_SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>).
          field_0x2c) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                  ,0x4e,
                                  "(this->propertyMap->GetValueAt(deletedPropertyIndex).propertyIndex == deletedPropertyIndex)"
                                  ,
                                  "this->propertyMap->GetValueAt(deletedPropertyIndex).propertyIndex == deletedPropertyIndex"
                                 );
      if (!bVar3) goto LAB_00e4ba0d;
      *puVar4 = 0;
    }
    pSVar5 = JsUtil::
             BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
             ::GetValueAt((this->
                          super_SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>
                          ).propertyMap.ptr,
                          (uint)*(ushort *)
                                 &(this->
                                  super_SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>
                                  ).field_0x2c);
    if ((pSVar5->Attributes & 8) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                  ,0x4f,
                                  "(this->propertyMap->GetValueAt(deletedPropertyIndex).Attributes & 0x08)"
                                  ,
                                  "this->propertyMap->GetValueAt(deletedPropertyIndex).Attributes & PropertyDeleted"
                                 );
      if (!bVar3) goto LAB_00e4ba0d;
      *puVar4 = 0;
    }
    *propertyIndex =
         *(unsigned_short *)
          &(this->
           super_SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>).
           field_0x2c;
    pvVar6 = DynamicObject::GetSlot
                       (object,(uint)*(ushort *)
                                      &(this->
                                       super_SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>
                                       ).field_0x2c);
    if (((ulong)pvVar6 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00e4ba0d;
      *puVar4 = 0;
    }
    if (((ulong)pvVar6 & 0xffff000000000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
      if (!bVar3) {
LAB_00e4ba0d:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    *(short *)&(this->
               super_SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>
               ).field_0x2c = (short)pvVar6;
  }
  return uVar1 != 0xffff;
}

Assistant:

bool SimpleDictionaryUnorderedTypeHandler<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::TryReuseDeletedPropertyIndex(
        DynamicObject *const object,
        TPropertyIndex *const propertyIndex)
    {
        Assert(object);
        Assert(propertyIndex);

        if(deletedPropertyIndex == PropertyIndexRanges<TPropertyIndex>::NoSlots)
        {
            return false;
        }

        Assert(this->propertyMap->GetValueAt(deletedPropertyIndex).propertyIndex == deletedPropertyIndex);
        Assert(this->propertyMap->GetValueAt(deletedPropertyIndex).Attributes & PropertyDeleted);

        *propertyIndex = deletedPropertyIndex;
        deletedPropertyIndex = static_cast<TPropertyIndex>(TaggedInt::ToInt32(object->GetSlot(deletedPropertyIndex)));
        return true;
    }